

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void bitset_shift_left(bitset_t *bitset,size_t s)

{
  long lVar1;
  byte bVar2;
  bitset_t *bitset_00;
  ulong in_RSI;
  long *in_RDI;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t as;
  int inword_shift;
  size_t extra_words;
  bitset_t *local_40;
  undefined1 *local_38;
  bitset_t *local_30;
  _Bool padwithzeroes;
  undefined4 in_stack_ffffffffffffffe0;
  
  bitset_00 = (bitset_t *)(in_RSI >> 6);
  bVar2 = (byte)in_RSI & 0x3f;
  lVar1 = in_RDI[1];
  padwithzeroes = SUB81((ulong)lVar1 >> 0x38,0);
  if ((in_RSI & 0x3f) == 0) {
    bitset_resize(bitset_00,CONCAT44((int)in_RSI,in_stack_ffffffffffffffe0) & 0x3fffffffff,
                  padwithzeroes);
    for (local_30 = (bitset_t *)((long)&bitset_00->array + lVar1); bitset_00 < local_30;
        local_30 = (bitset_t *)((long)&local_30[-1].capacity + 7)) {
      *(undefined8 *)(*in_RDI + (long)((long)&local_30[-1].capacity + 7) * 8) =
           *(undefined8 *)(*in_RDI + ((long)local_30 + (-1 - (long)bitset_00)) * 8);
    }
  }
  else {
    bitset_resize(bitset_00,CONCAT44((int)in_RSI,in_stack_ffffffffffffffe0) & 0x3fffffffff,
                  padwithzeroes);
    *(ulong *)(*in_RDI + ((long)&bitset_00->array + lVar1) * 8) =
         *(ulong *)(*in_RDI + (lVar1 + -1) * 8) >> (0x40 - bVar2 & 0x3f);
    for (local_38 = (undefined1 *)((long)&bitset_00->array + lVar1);
        (undefined1 *)((long)&bitset_00->array + 2) <= local_38; local_38 = local_38 + -1) {
      *(ulong *)(*in_RDI + (long)(local_38 + -1) * 8) =
           *(long *)(*in_RDI + (long)(local_38 + (-1 - (long)bitset_00)) * 8) << (bVar2 & 0x3f) |
           *(ulong *)(*in_RDI + (long)(local_38 + (-2 - (long)bitset_00)) * 8) >>
           (0x40 - bVar2 & 0x3f);
    }
    *(long *)(*in_RDI + (long)bitset_00 * 8) = *(long *)*in_RDI << (bVar2 & 0x3f);
  }
  for (local_40 = (bitset_t *)0x0; local_40 < bitset_00;
      local_40 = (bitset_t *)((long)&local_40->array + 1)) {
    *(undefined8 *)(*in_RDI + (long)local_40 * 8) = 0;
  }
  return;
}

Assistant:

void bitset_shift_left(bitset_t *bitset, size_t s) {
    size_t extra_words = s / 64;
    int inword_shift = s % 64;
    size_t as = bitset->arraysize;
    if (inword_shift == 0) {
        bitset_resize(bitset, as + extra_words, false);
        // could be done with a memmove
        for (size_t i = as + extra_words; i > extra_words; i--) {
            bitset->array[i - 1] = bitset->array[i - 1 - extra_words];
        }
    } else {
        bitset_resize(bitset, as + extra_words + 1, true);
        bitset->array[as + extra_words] =
            bitset->array[as - 1] >> (64 - inword_shift);
        for (size_t i = as + extra_words; i >= extra_words + 2; i--) {
            bitset->array[i - 1] =
                (bitset->array[i - 1 - extra_words] << inword_shift) |
                (bitset->array[i - 2 - extra_words] >> (64 - inword_shift));
        }
        bitset->array[extra_words] = bitset->array[0] << inword_shift;
    }
    for (size_t i = 0; i < extra_words; i++) {
        bitset->array[i] = 0;
    }
}